

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.cpp
# Opt level: O2

void __thiscall rw::BBox::calculate(BBox *this,V3d *points,int32 n)

{
  V3d *pVVar1;
  float fVar2;
  float32 fVar3;
  float32 fVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float fVar8;
  
  (this->inf).z = points->z;
  fVar3 = points->y;
  (this->inf).x = points->x;
  (this->inf).y = fVar3;
  fVar3 = points->y;
  (this->sup).x = points->x;
  (this->sup).y = fVar3;
  (this->sup).z = points->z;
  fVar3 = (this->inf).x;
  fVar4 = (this->inf).y;
  fVar5 = (this->sup).x;
  fVar6 = (this->sup).y;
  fVar7 = (this->inf).z;
  fVar8 = (float)(this->sup).z;
  while (n = n + -1, n != 0) {
    fVar2 = (float)points[1].x;
    if (fVar2 < (float)fVar3) {
      (this->inf).x = (float32)fVar2;
      fVar3 = (float32)fVar2;
    }
    fVar2 = (float)points[1].y;
    if (fVar2 < (float)fVar4) {
      (this->inf).y = (float32)fVar2;
      fVar4 = (float32)fVar2;
    }
    fVar2 = (float)points[1].z;
    if (fVar2 < (float)fVar7) {
      (this->inf).z = (float32)fVar2;
      fVar7 = (float32)fVar2;
    }
    pVVar1 = points + 1;
    fVar2 = (float)pVVar1->x;
    if ((float)fVar5 < fVar2) {
      (this->sup).x = (float32)fVar2;
      fVar5 = (float32)fVar2;
    }
    fVar2 = (float)points[1].y;
    if ((float)fVar6 < fVar2) {
      (this->sup).y = (float32)fVar2;
      fVar6 = (float32)fVar2;
    }
    fVar2 = (float)points[1].z;
    points = pVVar1;
    if (fVar8 < fVar2) {
      (this->sup).z = (float32)fVar2;
      fVar8 = fVar2;
    }
  }
  return;
}

Assistant:

void
BBox::calculate(V3d *points, int32 n)
{
	this->inf = points[0];
	this->sup = points[0];
	while(--n){
		points++;
		if(points->x < this->inf.x)
			this->inf.x = points->x;
		if(points->y < this->inf.y)
			this->inf.y = points->y;
		if(points->z < this->inf.z)
			this->inf.z = points->z;
		if(points->x > this->sup.x)
			this->sup.x = points->x;
		if(points->y > this->sup.y)
			this->sup.y = points->y;
		if(points->z > this->sup.z)
			this->sup.z = points->z;
	}
}